

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O2

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::async_write
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,string_view buf)

{
  _func_int **pp_Var1;
  _func_int *in_RCX;
  
  pp_Var1 = (_func_int **)operator_new(0x90,(nothrow_t *)&std::nothrow);
  if (pp_Var1 == (_func_int **)0x0) {
    (this->executor_wrapper_).super_Executor._vptr_Executor = (_func_int **)0x0;
  }
  else {
    *pp_Var1 = async_write;
    pp_Var1[1] = async_write;
    pp_Var1[0x10] = in_RCX;
    pp_Var1[0xf] = (_func_int *)buf._M_str;
    pp_Var1[0xe] = (_func_int *)buf._M_len;
    pp_Var1[2] = (_func_int *)0x0;
    pp_Var1[3] = (_func_int *)0x0;
    pp_Var1[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var1 + 8) = 0;
    (this->executor_wrapper_).super_Executor._vptr_Executor = pp_Var1;
    *(undefined1 *)(pp_Var1 + 0x11) = 0;
  }
  return (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)
         (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)this;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_write(
      std::string_view buf) {
    if constexpr (execute_type == execution_type::thread_pool) {
      co_return co_await async_read_write<false>(
          std::span(const_cast<char *>(buf.data()), buf.size()));
    }
    else {
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
      if (async_seq_file_ == nullptr) {
        co_return std::make_pair(
            std::make_error_code(std::errc::invalid_argument), 0);
      }
      auto [ec, size] =
          co_await coro_io::async_write(*async_seq_file_, asio::buffer(buf));
      co_return std::make_pair(ec, size);
#else
      co_return co_await async_read_write<false>(
          std::span(const_cast<char *>(buf.data()), buf.size()));
#endif
    }
  }